

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resampler.c
# Opt level: O2

void Resmpl_Exec_LinearUp(RESMPL_STATE *CAA,UINT32 length,WAVE_32BS *retSample)

{
  uint uVar1;
  int iVar2;
  DEV_SMPL *pDVar3;
  DEV_SMPL *pDVar4;
  undefined1 auVar5 [16];
  UINT32 UVar6;
  int iVar7;
  uint uVar8;
  UINT32 UVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  DEV_SMPL *StreamPnt [2];
  DEV_SMPL *local_48;
  DEV_SMPL *local_40;
  
  uVar1 = CAA->smpRateSrc;
  for (uVar12 = 0; length != uVar12; uVar12 = uVar12 + 1) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (ulong)CAA->smpP * (ulong)uVar1 * 0x800;
    auVar5 = auVar5 / ZEXT416(CAA->smpRateDst);
    uVar8 = auVar5._0_4_;
    uVar11 = uVar8 + 0x7ff >> 0xb;
    Resmpl_EnsureBuffers(CAA,(uVar11 - CAA->smpNext) + 2);
    pDVar3 = CAA->smplBufs[0];
    pDVar4 = CAA->smplBufs[1];
    *pDVar3 = (CAA->lSmpl).L;
    *pDVar4 = (CAA->lSmpl).R;
    pDVar3[1] = (CAA->nSmpl).L;
    pDVar4[1] = (CAA->nSmpl).R;
    UVar9 = uVar11 - CAA->smpNext;
    UVar6 = uVar11;
    if (UVar9 != 0) {
      local_48 = pDVar3 + 2;
      local_40 = pDVar4 + 2;
      (*CAA->StreamUpdate)(CAA->su_DataPtr,UVar9,&local_48);
      UVar6 = CAA->smpNext;
    }
    iVar7 = uVar8 + UVar6 * -0x800;
    CAA->smpLast = (uint)(auVar5._0_8_ >> 0xb) & 0x1fffff;
    CAA->smpNext = uVar11;
    uVar10 = (ulong)(uVar8 & 0x7ff);
    uVar11 = iVar7 + 0x800U >> 0xb;
    uVar8 = iVar7 + 0xfffU >> 0xb;
    iVar7 = pDVar4[uVar11];
    iVar2 = pDVar4[uVar8];
    retSample[uVar12].L =
         retSample[uVar12].L +
         (int)((long)((long)CAA->volumeL *
                     ((long)pDVar3[uVar8] * uVar10 + (long)pDVar3[uVar11] * (0x800 - uVar10))) /
              0x800);
    retSample[uVar12].R =
         retSample[uVar12].R +
         (int)((long)((long)CAA->volumeR * ((long)iVar2 * uVar10 + (long)iVar7 * (0x800 - uVar10)))
              / 0x800);
    (CAA->lSmpl).L = pDVar3[uVar11];
    (CAA->lSmpl).R = pDVar4[uVar11];
    (CAA->nSmpl).L = pDVar3[uVar8];
    (CAA->nSmpl).R = pDVar4[uVar8];
    CAA->smpP = CAA->smpP + 1;
  }
  uVar1 = CAA->smpRateSrc;
  if (uVar1 <= CAA->smpLast) {
    CAA->smpLast = CAA->smpLast - uVar1;
    CAA->smpNext = CAA->smpNext - uVar1;
    CAA->smpP = CAA->smpP - CAA->smpRateDst;
  }
  return;
}

Assistant:

static void Resmpl_Exec_LinearUp(RESMPL_STATE* CAA, UINT32 length, WAVE_32BS* retSample)
{
	// RESALGO_LINEAR_UP: Linear Upsampling
	DEV_SMPL* CurBufL;
	DEV_SMPL* CurBufR;
	DEV_SMPL* StreamPnt[0x02];
	UINT32 InBase;
	UINT32 InPos;
	UINT32 OutPos;
	UINT32 SmpFrc;	// Sample Fraction
	UINT32 InPre;
	UINT32 InNow;
	SLINT InPosL;
	INT64 TempSmpL;
	INT64 TempSmpR;
	INT32 SmpCnt;	// must be signed, else I'm getting calculation errors
	UINT64 ChipSmpRateFP;
	
	ChipSmpRateFP = FIXPNT_FACT * (UINT64)CAA->smpRateSrc;
	// TODO: Make it work *properly* with large blocks. (this is very hackish)
	for (OutPos = 0; OutPos < length; OutPos ++)
	{
		InPosL = (SLINT)(CAA->smpP * ChipSmpRateFP / CAA->smpRateDst);
		InPre = (UINT32)fp2i_floor(InPosL);
		InNow = (UINT32)fp2i_ceil(InPosL);
		
		Resmpl_EnsureBuffers(CAA, InNow - CAA->smpNext + 2);
		CurBufL = CAA->smplBufs[0];
		CurBufR = CAA->smplBufs[1];
		
		CurBufL[0] = CAA->lSmpl.L;
		CurBufR[0] = CAA->lSmpl.R;
		CurBufL[1] = CAA->nSmpl.L;
		CurBufR[1] = CAA->nSmpl.R;
		if (InNow != CAA->smpNext)
		{
			StreamPnt[0] = &CurBufL[2];
			StreamPnt[1] = &CurBufR[2];
			CAA->StreamUpdate(CAA->su_DataPtr, InNow - CAA->smpNext, StreamPnt);
		}
		
		InBase = FIXPNT_FACT + (UINT32)(InPosL - (SLINT)CAA->smpNext * FIXPNT_FACT);
		SmpCnt = FIXPNT_FACT;
		CAA->smpLast = InPre;
		CAA->smpNext = InNow;
		//for (OutPos = 0; OutPos < length; OutPos ++)
		//{
		//InPos = InBase + (UINT32)(OutPos * ChipSmpRateFP / CAA->smpRateDst);
		InPos = InBase;
		
		InPre = fp2i_floor(InPos);
		InNow = fp2i_ceil(InPos);
		SmpFrc = getfraction(InPos);
		
		// Linear interpolation
		TempSmpL = ((INT64)CurBufL[InPre] * (FIXPNT_FACT - SmpFrc)) +
					((INT64)CurBufL[InNow] * SmpFrc);
		TempSmpR = ((INT64)CurBufR[InPre] * (FIXPNT_FACT - SmpFrc)) +
					((INT64)CurBufR[InNow] * SmpFrc);
		retSample[OutPos].L += (INT32)(TempSmpL * CAA->volumeL / SmpCnt);
		retSample[OutPos].R += (INT32)(TempSmpR * CAA->volumeR / SmpCnt);
		//}
		CAA->lSmpl.L = CurBufL[InPre];
		CAA->lSmpl.R = CurBufR[InPre];
		CAA->nSmpl.L = CurBufL[InNow];
		CAA->nSmpl.R = CurBufR[InNow];
		CAA->smpP ++;
	}
	
	if (CAA->smpLast >= CAA->smpRateSrc)
	{
		CAA->smpLast -= CAA->smpRateSrc;
		CAA->smpNext -= CAA->smpRateSrc;
		CAA->smpP -= CAA->smpRateDst;
	}
	
	return;
}